

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.h
# Opt level: O0

void __thiscall
slang::ast::AssignmentExpression::visitExprs<no_legacy_generate::MainVisitor&>
          (AssignmentExpression *this,AlwaysFFVisitor *visitor)

{
  Expression *in_RSI;
  AssignmentExpression *in_RDI;
  TimingControl *unaff_retaddr;
  
  if (in_RDI->timingControl != (TimingControl *)0x0) {
    TimingControl::visit<no_legacy_generate::MainVisitor>(unaff_retaddr,(AlwaysFFVisitor *)in_RDI);
  }
  left(in_RDI);
  Expression::visit<no_legacy_generate::MainVisitor&>(in_RSI,(AlwaysFFVisitor *)in_RDI);
  right(in_RDI);
  Expression::visit<no_legacy_generate::MainVisitor&>(in_RSI,(AlwaysFFVisitor *)in_RDI);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        if (timingControl)
            timingControl->visit(visitor);
        left().visit(visitor);
        right().visit(visitor);
    }